

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int MemHashAppend(unqlite_kv_engine *pKv,void *pKey,int nKeyLen,void *pData,unqlite_int64 nDataLen)

{
  bool bVar1;
  sxu32 sVar2;
  sxu32 sVar3;
  mem_hash_record *pmVar4;
  void *pvVar5;
  long lVar6;
  
  if (0xffffffff < nDataLen) {
    (*pKv->pIo->xErr)(pKv->pIo->pHandle,"Record size limit reached");
    return -7;
  }
  pmVar4 = MemHashGetEntry((mem_hash_kv_engine *)pKv,pKey,nKeyLen);
  if (pmVar4 == (mem_hash_record *)0x0) {
    sVar2 = (*(code *)pKv[0x18].pIo)(pKey,nKeyLen);
    pmVar4 = MemHashNewRecord((mem_hash_kv_engine *)pKv,pKey,nKeyLen,pData,nDataLen,sVar2);
    if (pmVar4 == (mem_hash_record *)0x0) {
      return -1;
    }
    MemHashLinkRecord((mem_hash_kv_engine *)pKv,pmVar4);
    if (99999 < *(uint *)&pKv[0x1a].pIo) {
      return 0;
    }
    if (*(uint *)&pKv[0x1a].pIo << 2 < *(uint *)((long)&pKv[0x1a].pIo + 4)) {
      return 0;
    }
    MemHashGrowTable((mem_hash_kv_engine *)pKv);
    return 0;
  }
  lVar6 = (ulong)pmVar4->nDataLen + nDataLen;
  if (lVar6 < 0x100000000) {
    sVar2 = (sxu32)lVar6;
    pvVar5 = SyMemBackendRealloc((SyMemBackend *)(pKv + 1),pmVar4->pData,sVar2);
    if (pvVar5 != (void *)0x0) {
      sVar3 = SyMemcpy(pData,(void *)((ulong)pmVar4->nDataLen + (long)pvVar5),(sxu32)nDataLen);
      pmVar4->pData = pvVar5;
      pmVar4->nDataLen = sVar2;
      bVar1 = true;
      goto LAB_00111926;
    }
    sVar3 = 0xffffffff;
  }
  else {
    (*pKv->pIo->xErr)(pKv->pIo->pHandle,"Append operation will cause data overflow");
    sVar3 = 0xfffffff9;
  }
  bVar1 = false;
LAB_00111926:
  if (bVar1) {
    return 0;
  }
  return sVar3;
}

Assistant:

static int MemHashAppend(
	  unqlite_kv_engine *pKv,
	  const void *pKey,int nKeyLen,
	  const void *pData,unqlite_int64 nDataLen
	  )
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pKv;
	mem_hash_record *pRecord;
	if( nDataLen > SXU32_HIGH ){
		/* Database limit */
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"Record size limit reached");
		return UNQLITE_LIMIT;
	}
	/* Fetch the record first */
	pRecord = MemHashGetEntry(pEngine,pKey,nKeyLen);
	if( pRecord == 0 ){
		/* Allocate a new record */
		pRecord = MemHashNewRecord(pEngine,
			pKey,nKeyLen,
			pData,nDataLen,
			pEngine->xHash(pKey,nKeyLen)
			);
		if( pRecord == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Link the entry */
		MemHashLinkRecord(pEngine,pRecord);
		if( pEngine->nRecord * MEM_HASH_FILL_FACTOR >= pEngine->nBucket && pEngine->nRecord < 100000 ){
			/* Rehash the table */
			MemHashGrowTable(pEngine);
		}
	}else{
		unqlite_int64 nNew = pRecord->nDataLen + nDataLen;
		void *pOld = (void *)pRecord->pData;
		sxu32 nData;
		char *zNew;
		/* Append data to the existing record */
		if( nNew > SXU32_HIGH ){
			/* Overflow */
			pEngine->pIo->xErr(pEngine->pIo->pHandle,"Append operation will cause data overflow");	
			return UNQLITE_LIMIT;
		}
		nData = (sxu32)nNew;
		/* Allocate bigger chunk */
		zNew = (char *)SyMemBackendRealloc(&pEngine->sAlloc,pOld,nData);
		if( zNew == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Reflect the change */
		SyMemcpy(pData,&zNew[pRecord->nDataLen],(sxu32)nDataLen);
		pRecord->pData = (const void *)zNew;
		pRecord->nDataLen = nData;
	}
	return UNQLITE_OK;
}